

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFanout.c
# Opt level: O0

void Ivy_ObjCollectFanouts(Ivy_Man_t *p,Ivy_Obj_t *pObj,Vec_Ptr_t *vArray)

{
  int iVar1;
  Ivy_Obj_t *local_28;
  Ivy_Obj_t *pFanout;
  Vec_Ptr_t *vArray_local;
  Ivy_Obj_t *pObj_local;
  Ivy_Man_t *p_local;
  
  if (p->fFanout == 0) {
    __assert_fail("p->fFanout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFanout.c"
                  ,0x109,"void Ivy_ObjCollectFanouts(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *)");
  }
  iVar1 = Ivy_IsComplement(pObj);
  if (iVar1 == 0) {
    Vec_PtrClear(vArray);
    for (local_28 = pObj->pFanout; local_28 != (Ivy_Obj_t *)0x0;
        local_28 = Ivy_ObjNextFanout(pObj,local_28)) {
      Vec_PtrPush(vArray,local_28);
    }
    return;
  }
  __assert_fail("!Ivy_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFanout.c"
                ,0x10a,"void Ivy_ObjCollectFanouts(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

void Ivy_ObjCollectFanouts( Ivy_Man_t * p, Ivy_Obj_t * pObj, Vec_Ptr_t * vArray )
{
    Ivy_Obj_t * pFanout;
    assert( p->fFanout );
    assert( !Ivy_IsComplement(pObj) );
    Vec_PtrClear( vArray );
    Ivy_ObjForEachFanoutInt( pObj, pFanout )
        Vec_PtrPush( vArray, pFanout );
}